

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O3

int __thiscall jbcoin::Serializer::add64(Serializer *this,uint64_t i)

{
  pointer *ppuVar1;
  pointer puVar2;
  iterator __position;
  uchar uVar3;
  undefined8 in_RAX;
  iterator iVar4;
  undefined1 local_28;
  uchar local_27;
  uchar local_26;
  uchar local_25;
  uchar local_24;
  uchar local_23;
  uchar local_22;
  uchar local_21;
  
  puVar2 = (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  __position._M_current =
       (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar3 = (uchar)(i >> 0x38);
  _local_28 = (undefined7)in_RAX;
  _local_28 = CONCAT17(uVar3,_local_28);
  if (__position._M_current ==
      (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&this->mData,__position,&local_21);
    iVar4._M_current =
         (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = uVar3;
    iVar4._M_current =
         (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  uVar3 = (uchar)(i >> 0x30);
  _local_28 = CONCAT16(uVar3,_local_28);
  if (iVar4._M_current ==
      (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&this->mData,iVar4,&local_22);
    iVar4._M_current =
         (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = uVar3;
    iVar4._M_current =
         (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  uVar3 = (uchar)(i >> 0x28);
  _local_28 = CONCAT15(uVar3,_local_28);
  if (iVar4._M_current ==
      (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&this->mData,iVar4,&local_23);
    iVar4._M_current =
         (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = uVar3;
    iVar4._M_current =
         (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  uVar3 = (uchar)(i >> 0x20);
  _local_28 = CONCAT14(uVar3,_local_28);
  if (iVar4._M_current ==
      (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&this->mData,iVar4,&local_24);
    iVar4._M_current =
         (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = uVar3;
    iVar4._M_current =
         (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  uVar3 = (uchar)(i >> 0x18);
  _local_28 = CONCAT13(uVar3,_local_28);
  if (iVar4._M_current ==
      (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&this->mData,iVar4,&local_25);
    iVar4._M_current =
         (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = uVar3;
    iVar4._M_current =
         (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  uVar3 = (uchar)(i >> 0x10);
  _local_28 = CONCAT12(uVar3,_local_28);
  if (iVar4._M_current ==
      (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&this->mData,iVar4,&local_26);
    iVar4._M_current =
         (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = uVar3;
    iVar4._M_current =
         (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  uVar3 = (uchar)(i >> 8);
  _local_28 = CONCAT11(uVar3,local_28);
  if (iVar4._M_current ==
      (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&this->mData,iVar4,&local_27);
    iVar4._M_current =
         (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = uVar3;
    iVar4._M_current =
         (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  _local_28 = CONCAT71(_local_27,(uchar)i);
  if (iVar4._M_current ==
      (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&this->mData,iVar4,&local_28);
  }
  else {
    *iVar4._M_current = (uchar)i;
    ppuVar1 = &(this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  return (int)__position._M_current - (int)puVar2;
}

Assistant:

int Serializer::add64 (std::uint64_t i)
{
    int ret = mData.size ();
    mData.push_back (static_cast<unsigned char> (i >> 56));
    mData.push_back (static_cast<unsigned char> ((i >> 48) & 0xff));
    mData.push_back (static_cast<unsigned char> ((i >> 40) & 0xff));
    mData.push_back (static_cast<unsigned char> ((i >> 32) & 0xff));
    mData.push_back (static_cast<unsigned char> ((i >> 24) & 0xff));
    mData.push_back (static_cast<unsigned char> ((i >> 16) & 0xff));
    mData.push_back (static_cast<unsigned char> ((i >> 8) & 0xff));
    mData.push_back (static_cast<unsigned char> (i & 0xff));
    return ret;
}